

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::sr::anon_unknown_1::BuiltinInputVariationsCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,BuiltinInputVariationsCaseInstance *this)

{
  TestStatus *__return_storage_ptr___00;
  bool bVar1;
  int y;
  int iVar2;
  int x;
  int iVar3;
  float fVar4;
  RGBA local_108;
  RGBA threshold;
  Surface refImage;
  PixelBufferAccess local_e8;
  TestStatus *local_c0;
  Vec4 *local_b8;
  VkPushConstantRange pcRanges;
  Surface resImage;
  ConstPixelBufferAccess local_88;
  deUint16 indices [12];
  UVec2 viewportSize;
  
  ShaderRenderCaseInstance::getViewportSize(&this->super_ShaderRenderCaseInstance);
  threshold.m_value = 0x2020202;
  tcu::Surface::Surface(&resImage,viewportSize.m_data[0],viewportSize.m_data[1]);
  tcu::Surface::Surface(&refImage,viewportSize.m_data[0],viewportSize.m_data[1]);
  pcRanges.size = 0x10;
  pcRanges.stageFlags = 0x10;
  pcRanges.offset = 0;
  indices[0] = 0;
  indices[1] = 4;
  indices[2] = 1;
  indices[3] = 0;
  indices[4] = 5;
  indices[5] = 4;
  indices[6] = 1;
  indices[7] = 2;
  indices[8] = 3;
  indices[9] = 1;
  indices[10] = 3;
  indices[0xb] = 4;
  (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[4])(this);
  if ((this->m_shaderInputTypes & 4) != 0) {
    ShaderRenderCaseInstance::setPushConstantRanges
              (&this->super_ShaderRenderCaseInstance,1,&pcRanges);
  }
  local_e8.super_ConstPixelBufferAccess.m_format.order = 0x3e000000;
  local_e8.super_ConstPixelBufferAccess.m_format.type = 0x3e800000;
  local_e8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3f000000;
  local_e8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f800000;
  ShaderRenderCaseInstance::render
            (&this->super_ShaderRenderCaseInstance,6,4,indices,(Vec4 *)&local_e8);
  tcu::Surface::getAccess(&local_e8,&resImage);
  local_c0 = __return_storage_ptr__;
  tcu::TextureLevel::getAccess(&local_88,&(this->super_ShaderRenderCaseInstance).m_resultImage);
  tcu::copy((EVP_PKEY_CTX *)&local_e8,(EVP_PKEY_CTX *)&local_88);
  local_b8 = &this->m_constantColor;
  for (iVar2 = 0; iVar2 < refImage.m_height; iVar2 = iVar2 + 1) {
    for (iVar3 = 0; iVar3 < refImage.m_width; iVar3 = iVar3 + 1) {
      local_e8.super_ConstPixelBufferAccess.m_format.order = 0x3dcccccd;
      local_e8.super_ConstPixelBufferAccess.m_format.type = 0x3e4ccccd;
      local_e8.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3e99999a;
      local_e8.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f800000;
      if ((refImage.m_width / 2 <= iVar3 & (byte)this->m_shaderInputTypes) == 0) {
        if ((this->m_shaderInputTypes & 2) == 0) {
          local_88.m_format.order = 0x3e99999a;
          local_88.m_format.type = 0x3e4ccccd;
          local_88.m_size.m_data[0] = 0x3dcccccd;
          local_88.m_size.m_data[1] = 0;
        }
        else {
          fVar4 = ((float)iVar3 + 0.5) / (float)refImage.m_width;
          local_88.m_format.type = (ChannelType)(fVar4 * 0.6);
          local_88.m_format.order = (ChannelOrder)((1.0 - fVar4) * 0.6);
          local_88.m_size.m_data[0] = 0;
          local_88.m_size.m_data[1] = 0;
        }
        tcu::Vector<float,_4>::operator+=
                  ((Vector<float,_4> *)&local_e8,(Vector<float,_4> *)&local_88);
      }
      if ((this->m_shaderInputTypes & 4) != 0) {
        tcu::Vector<float,_4>::operator+=((Vector<float,_4> *)&local_e8,local_b8);
      }
      tcu::RGBA::RGBA(&local_108,(Vec4 *)&local_e8);
      *(deUint32 *)((long)refImage.m_pixels.m_ptr + (long)(refImage.m_width * iVar2 + iVar3) * 4) =
           local_108.m_value;
    }
  }
  bVar1 = tcu::pixelThresholdCompare
                    (((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context)->
                     m_testCtx->m_log,"Result","Image comparison result",&refImage,&resImage,
                     &threshold,COMPARE_LOG_RESULT);
  __return_storage_ptr___00 = local_c0;
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"Result image matches reference",(allocator<char> *)&local_88);
    tcu::TestStatus::pass(__return_storage_ptr___00,(string *)&local_e8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e8,"Image mismatch",(allocator<char> *)&local_88);
    tcu::TestStatus::fail(__return_storage_ptr___00,(string *)&local_e8);
  }
  std::__cxx11::string::~string((string *)&local_e8);
  tcu::Surface::~Surface(&refImage);
  tcu::Surface::~Surface(&resImage);
  return __return_storage_ptr___00;
}

Assistant:

TestStatus BuiltinInputVariationsCaseInstance::iterate (void)
{
	const UVec2					viewportSize	= getViewportSize();
	const int					width			= viewportSize.x();
	const int					height			= viewportSize.y();
	const tcu::RGBA				threshold		(2, 2, 2, 2);
	Surface						resImage		(width, height);
	Surface						refImage		(width, height);
	bool						compareOk		= false;
	const VkPushConstantRange	pcRanges		=
	{
		VK_SHADER_STAGE_FRAGMENT_BIT,	// VkShaderStageFlags	stageFlags;
		0u,								// deUint32				offset;
		sizeof(Vec4)					// deUint32				size;
	};
	const deUint16				indices[12]		=
	{
		0, 4, 1,
		0, 5, 4,
		1, 2, 3,
		1, 3, 4
	};

	setup();

	if (m_shaderInputTypes & SHADER_INPUT_CONSTANT_BIT)
		setPushConstantRanges(1, &pcRanges);

	render(6, 4, indices);
	copy(resImage.getAccess(), getResultImage().getAccess());

	// Reference image
	for (int y = 0; y < refImage.getHeight(); y++)
	{
		for (int x = 0; x < refImage.getWidth(); x++)
		{
			Vec4 color (0.1f, 0.2f, 0.3f, 1.0f);

			if (((m_shaderInputTypes & SHADER_INPUT_BUILTIN_BIT) && (x < refImage.getWidth() / 2)) ||
				!(m_shaderInputTypes & SHADER_INPUT_BUILTIN_BIT))
			{
				if (m_shaderInputTypes & SHADER_INPUT_VARYING_BIT)
				{
					const float xf = (float(x)+.5f) / float(refImage.getWidth());
					color += Vec4(0.6f * (1 - xf), 0.6f * xf, 0.0f, 0.0f);
				}
				else
					color += Vec4(0.3f, 0.2f, 0.1f, 0.0f);
			}

			if (m_shaderInputTypes & SHADER_INPUT_CONSTANT_BIT)
				color += m_constantColor;

			refImage.setPixel(x, y, RGBA(color));
		}
	}

	compareOk = pixelThresholdCompare(m_context.getTestContext().getLog(), "Result", "Image comparison result", refImage, resImage, threshold, COMPARE_LOG_RESULT);

	if (compareOk)
		return TestStatus::pass("Result image matches reference");
	else
		return TestStatus::fail("Image mismatch");
}